

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

void libtorrent::anon_unknown_40::add_files_impl
               (vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                *files,string *p,string *l,
               function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *pred,create_flags_t flags)

{
  bool bVar1;
  char *in_R9;
  string_view lhs;
  string_view lhs_00;
  string_view rhs;
  string_view rhs_00;
  file_flags_t file_flags;
  string leaf;
  string sym_path;
  error_code ec;
  string f;
  file_status s;
  bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void> local_12d;
  create_flags_t local_12c;
  vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *local_128;
  string local_120;
  undefined1 local_100 [40];
  bool local_d8;
  error_code local_d0;
  string local_c0;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  file_status local_58;
  
  lhs._M_str = (char *)l->_M_string_length;
  lhs._M_len = (size_t)(p->_M_dataplus)._M_p;
  rhs._M_str = in_R9;
  rhs._M_len = (size_t)(l->_M_dataplus)._M_p;
  local_12c.m_val = flags.m_val;
  local_128 = (vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>> *
              )files;
  combine_path_abi_cxx11_(&local_c0,(libtorrent *)p->_M_string_length,lhs,rhs);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_c0._M_dataplus._M_p,
             local_c0._M_dataplus._M_p + local_c0._M_string_length);
  if ((pred->super__Function_base)._M_manager == (_Manager_type)0x0) {
    ::std::__throw_bad_function_call();
  }
  bVar1 = (*pred->_M_invoker)((_Any_data *)pred,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (!bVar1) goto LAB_001976dc;
  local_d0.val_ = 0;
  local_d0.failed_ = false;
  local_d0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_58.mode.m_val = 0;
  local_58.mtime = 0;
  local_58.ctime = 0;
  local_58.file_size = 0;
  local_58.atime = 0;
  stat_file(&local_c0,&local_58,&local_d0,(file_status_flag_t)((local_12c.m_val & 8) >> 3));
  if (local_d0.failed_ != false) goto LAB_001976dc;
  if ((local_58.mode.m_val & 8) == 0) {
    if ((local_58.mode.m_val & 1) != 0) {
LAB_001975a5:
      aux::directory::directory((directory *)local_100,&local_c0,&local_d0);
      while (local_d8 != true) {
        aux::directory::file_abi_cxx11_(&local_120,(directory *)local_100);
        bVar1 = ignore_subdir(&local_120);
        if (!bVar1) {
          lhs_00._M_str = (char *)local_120._M_string_length;
          lhs_00._M_len = (size_t)(l->_M_dataplus)._M_p;
          rhs_00._M_str = in_R9;
          rhs_00._M_len = (size_t)local_120._M_dataplus._M_p;
          combine_path_abi_cxx11_(&local_98,(libtorrent *)l->_M_string_length,lhs_00,rhs_00);
          add_files_impl((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                          *)local_128,p,&local_98,pred,local_12c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        aux::directory::next((directory *)local_100,&local_d0);
      }
      aux::directory::~directory((directory *)local_100);
      goto LAB_001976dc;
    }
  }
  else if (((local_12c.m_val & 8) == 0 & (byte)local_58.mode.m_val) != 0) goto LAB_001975a5;
  local_12d.m_val = (byte)(local_58.mode.m_val & 8) | (byte)local_58.mode.m_val & 6;
  if ((local_12c.m_val >> 8 & 1) != 0) {
    local_12d.m_val = 0;
  }
  if (local_12d.m_val < 8 || (local_12c.m_val & 8) == 0) {
    local_100._0_8_ = local_58.mtime;
    ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
    emplace_back<std::__cxx11::string,long&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long>
              (local_128,l,&local_58.file_size,&local_12d,(long *)local_100);
  }
  else {
    aux::get_symlink_path((string *)local_100,&local_c0);
    local_9c = 0;
    local_120._M_dataplus._M_p = (pointer)local_58.mtime;
    ::std::vector<libtorrent::create_file_entry,std::allocator<libtorrent::create_file_entry>>::
    emplace_back<std::__cxx11::string,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::file_flags_tag,void>const&,long,std::__cxx11::string>
              (local_128,l,&local_9c,&local_12d,(long *)&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
  }
LAB_001976dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add_files_impl(std::vector<create_file_entry>& files
		, std::string const& p
		, std::string l
		, std::function<bool(std::string)> const& pred
		, create_flags_t const flags)
	{
		std::string f = combine_path(p, l);
		if (!pred(f)) return;
		error_code ec;
		file_status s;
		stat_file(f, &s, ec, (flags & create_torrent::symlinks) ? dont_follow_links : file_status_flag_t{});
		if (ec) return;

		// recurse into directories
		bool recurse = bool(s.mode & file_status::directory);

		// if the file is not a link or we're following links, and it's a directory
		// only then should we recurse
		if ((s.mode & file_status::symlink) && (flags & create_torrent::symlinks))
			recurse = false;

		if (recurse)
		{
			for (aux::directory i(std::move(f), ec); !i.done(); i.next(ec))
			{
				std::string leaf = i.file();
				if (ignore_subdir(leaf)) continue;
				add_files_impl(files, p, combine_path(std::move(l), std::move(leaf)), pred, flags);
			}
		}
		else
		{
			file_flags_t const file_flags = (flags & create_torrent::no_attributes)
				? file_flags_t{}
				: ((s.mode & file_status::hidden) ? file_storage::flag_hidden : file_flags_t{})
					| ((s.mode & file_status::executable) ? file_storage::flag_executable : file_flags_t{})
					| ((s.mode & file_status::symlink) ? file_storage::flag_symlink : file_flags_t{})
					;

			// mask all bits to check if the file is a symlink
			if ((file_flags & file_storage::flag_symlink)
				&& (flags & create_torrent::symlinks))
			{
				std::string sym_path = aux::get_symlink_path(f);
				files.emplace_back(std::move(l), 0, file_flags, std::time_t(s.mtime)
					, std::move(sym_path));
			}
			else
			{
				files.emplace_back(std::move(l), s.file_size, file_flags, std::time_t(s.mtime));
			}
		}
	}